

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O2

QString * QXkbCommon::lookupStringNoKeysymTransformations
                    (QString *__return_storage_ptr__,xkb_keysym_t keysym)

{
  int iVar1;
  long in_FS_OFFSET;
  QVarLengthArray<char,_32LL> local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.super_QVLABase<char>.super_QVLABaseBase.ptr = &local_60.super_QVLAStorage<1UL,_1UL,_32LL>
  ;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x10] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x11] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x12] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x13] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x14] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x15] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x16] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x17] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x18] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x19] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x1a] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x1b] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x1c] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x1d] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x1e] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0x1f] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[1] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[2] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[3] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[4] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[5] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[6] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[7] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[8] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[9] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[10] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0xb] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0xc] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0xd] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0xe] = -0x56;
  local_60.super_QVLAStorage<1UL,_1UL,_32LL>.array[0xf] = -0x56;
  local_60.super_QVLABase<char>.super_QVLABaseBase.a = 0x20;
  local_60.super_QVLABase<char>.super_QVLABaseBase.s = 0x20;
  iVar1 = xkb_keysym_to_utf8(keysym);
  if (iVar1 == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if (local_60.super_QVLABase<char>.super_QVLABaseBase.s < iVar1) {
      QVarLengthArray<char,_32LL>::resize(&local_60,(long)iVar1);
      xkb_keysym_to_utf8(keysym,local_60.super_QVLABase<char>.super_QVLABaseBase.ptr,
                         local_60.super_QVLABase<char>.super_QVLABaseBase.s);
    }
    QString::fromUtf8(__return_storage_ptr__,
                      (char *)local_60.super_QVLABase<char>.super_QVLABaseBase.ptr,
                      (long)(iVar1 + -1));
  }
  QVarLengthArray<char,_32LL>::~QVarLengthArray(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QXkbCommon::lookupStringNoKeysymTransformations(xkb_keysym_t keysym)
{
    QVarLengthArray<char, 32> chars(32);
    const int size = xkb_keysym_to_utf8(keysym, chars.data(), chars.size());
    if (size == 0)
        return QString(); // the keysym does not have a Unicode representation

    if (Q_UNLIKELY(size > chars.size())) {
        chars.resize(size);
        xkb_keysym_to_utf8(keysym, chars.data(), chars.size());
    }
    return QString::fromUtf8(chars.constData(), size - 1);
}